

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute_mst.c
# Opt level: O0

void cut_and_splice(TreeNode *n1,TreeNode *n2,int new_x,int new_y,int *x1,int *y1,int *x2,int *y2,
                   TreeNode *e,int n2ton1)

{
  TreeNode_s *pTVar1;
  TreeNode *n2_00;
  dl_el *pdVar2;
  dl_t paVar3;
  dl_el_s *pdVar4;
  dl_el *_el_3;
  dl_el *_el_2;
  dl_el *_el_1;
  dl_el *_el;
  TreeNode *s;
  TreeNode *node;
  TreeNode *p1;
  int *y1_local;
  int *x1_local;
  int new_y_local;
  int new_x_local;
  TreeNode *n2_local;
  TreeNode *n1_local;
  
  pTVar1 = n1->parent;
  remove_child(pTVar1->children,n1);
  n2_00 = (TreeNode *)malloc(0x38);
  n2_00->x = new_x;
  n2_00->y = new_y;
  n2_00->mark = curr_mark;
  n2_00->parent = pTVar1;
  pdVar2 = (dl_el *)malloc(0x18);
  if (pdVar2 == (dl_el *)0x0) {
    printf("Out of memory!!\n");
  }
  else {
    pdVar2[1].prev = (dl_el_s *)n2_00;
    pdVar2->next = (dl_el_s *)0x0;
    if (pTVar1->children->count == 0) {
      pdVar2->prev = (dl_el_s *)0x0;
      pTVar1->children->last = pdVar2;
      pTVar1->children->first = pdVar2;
      pTVar1->children->count = 1;
    }
    else {
      pdVar2->prev = pTVar1->children->last;
      pTVar1->children->last->next = pdVar2;
      pTVar1->children->last = pdVar2;
      pTVar1->children->count = pTVar1->children->count + 1;
    }
  }
  n1->parent = n2_00;
  paVar3 = dl_alloc();
  n2_00->children = paVar3;
  pdVar2 = (dl_el *)malloc(0x18);
  if (pdVar2 == (dl_el *)0x0) {
    printf("Out of memory!!\n");
  }
  else {
    pdVar2[1].prev = (dl_el_s *)n1;
    pdVar2->next = (dl_el_s *)0x0;
    if (n2_00->children->count == 0) {
      pdVar2->prev = (dl_el_s *)0x0;
      n2_00->children->last = pdVar2;
      n2_00->children->first = pdVar2;
      n2_00->children->count = 1;
    }
    else {
      pdVar2->prev = n2_00->children->last;
      n2_00->children->last->next = pdVar2;
      n2_00->children->last = pdVar2;
      n2_00->children->count = n2_00->children->count + 1;
    }
  }
  n2_00->order = -1;
  n2_00->e = n1->e;
  n2_00->id = n1->id;
  if (*x1 == n1->x) {
    *x2 = new_x;
  }
  else {
    *x1 = new_x;
  }
  if (*y1 == n1->y) {
    *y2 = new_y;
  }
  else {
    *y1 = new_y;
  }
  _new_y_local = n2;
  if (-1 < n2->order) {
    _el = (dl_el *)n2->parent;
    if ((((TreeNode_s *)_el)->x != n2->x) || (((TreeNode_s *)_el)->y != n2->y)) {
      _el = (dl_el *)malloc(0x38);
      ((TreeNode_s *)_el)->mark = curr_mark;
      ((TreeNode_s *)_el)->order = -1;
      ((TreeNode_s *)_el)->id = n2->id;
      ((TreeNode_s *)_el)->x = n2->x;
      ((TreeNode_s *)_el)->y = n2->y;
      ((TreeNode_s *)_el)->e = n2->e;
      if (((TreeNode_s *)_el)->e == n2) {
        ((TreeNode_s *)_el)->e = (TreeNode_s *)_el;
      }
      if (e == n2) {
        e = (TreeNode *)_el;
      }
      ((TreeNode_s *)_el)->len = n2->len;
      ((TreeNode_s *)_el)->blen = n2->blen;
      n2->blen = 0;
      remove_child(n2->parent->children,n2);
      pdVar2 = (dl_el *)malloc(0x18);
      if (pdVar2 == (dl_el *)0x0) {
        printf("Out of memory!!\n");
      }
      else {
        pdVar2[1].prev = _el;
        pdVar2->next = (dl_el_s *)0x0;
        if (n2->parent->children->count == 0) {
          pdVar2->prev = (dl_el_s *)0x0;
          n2->parent->children->last = pdVar2;
          n2->parent->children->first = pdVar2;
          n2->parent->children->count = 1;
        }
        else {
          pdVar2->prev = n2->parent->children->last;
          n2->parent->children->last->next = pdVar2;
          n2->parent->children->last = pdVar2;
          paVar3 = n2->parent->children;
          paVar3->count = paVar3->count + 1;
        }
      }
      ((TreeNode_s *)_el)->parent = n2->parent;
      n2->parent = (TreeNode_s *)_el;
      paVar3 = dl_alloc();
      ((TreeNode_s *)_el)->children = paVar3;
      pdVar4 = (dl_el_s *)malloc(0x18);
      if (pdVar4 == (dl_el_s *)0x0) {
        printf("Out of memory!!\n");
      }
      else {
        pdVar4[1].prev = (dl_el_s *)n2;
        pdVar4->next = (dl_el_s *)0x0;
        if (((TreeNode_s *)_el)->children->count == 0) {
          pdVar4->prev = (dl_el_s *)0x0;
          ((TreeNode_s *)_el)->children->last = pdVar4;
          ((TreeNode_s *)_el)->children->first = pdVar4;
          ((TreeNode_s *)_el)->children->count = 1;
        }
        else {
          pdVar4->prev = ((TreeNode_s *)_el)->children->last;
          ((TreeNode_s *)_el)->children->last->next = pdVar4;
          ((TreeNode_s *)_el)->children->last = pdVar4;
          ((TreeNode_s *)_el)->children->count = ((TreeNode_s *)_el)->children->count + 1;
        }
      }
    }
    _new_y_local = (TreeNode *)_el;
  }
  if (n2ton1 == 0) {
    splice2(_new_y_local,n2_00,e);
  }
  else {
    splice2(n2_00,_new_y_local,e);
  }
  return;
}

Assistant:

void cut_and_splice(TreeNode *n1, TreeNode *n2,
		    DTYPE new_x, DTYPE new_y,
		    DTYPE *x1, DTYPE *y1, DTYPE *x2, DTYPE *y2,
		    TreeNode *e, int n2ton1)
{
  TreeNode *p1, *node, *s;
  
  /* new steiner node */
  p1 = n1->parent;
  remove_child(p1->children, n1);
  node = (TreeNode*)malloc(sizeof(TreeNode));
  node->x = new_x;
  node->y = new_y;
  node->mark = curr_mark;

  node->parent = p1;
  dl_append(TreeNode*, p1->children, node);
  n1->parent = node;
  node->children = dl_alloc();
  dl_append(TreeNode*, node->children, n1);
  node->order = -1;

  node->e = n1->e;
  node->id = n1->id;

  if (*x1==n1->x) {
    *x2 = new_x;
  } else {
    *x1 = new_x;
  }
  if (*y1==n1->y) {
    *y2 = new_y;
  } else {
    *y1 = new_y;
  }

  if (n2->order >= 0) {
    /* n2 is a pin, need to replicate a steiner node */
    s = n2->parent;
    if (s->x!=n2->x || s->y!=n2->y) {
      s = (TreeNode*)malloc(sizeof(TreeNode));
      s->mark = curr_mark;
      s->order = -1;
      s->id = n2->id;
      s->x = n2->x;
      s->y = n2->y;
      s->e = n2->e;
      if (s->e == n2) {
	s->e = s;
      }
      if (e == n2) {
	e = s;
      }
      s->len = n2->len;
      s->blen = n2->blen;
      n2->blen = 0;

      remove_child(n2->parent->children, n2);
      dl_append(TreeNode*, n2->parent->children, s);
      s->parent = n2->parent;
      n2->parent = s;
      s->children = dl_alloc();
      dl_append(TreeNode*, s->children, n2);
    }
    n2 = s;
  }

  if (n2ton1) {
    splice2(node, n2, e);
  } else {
    splice2(n2, node, e);
  }
}